

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
::find_impl<int>(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                 *this,key_arg<int> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  int iVar2;
  ctrl_t *pcVar3;
  ulong uVar4;
  slot_type *psVar5;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  __m128i match;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  char cVar30;
  char cVar32;
  char cVar33;
  char cVar34;
  
  pcVar3 = this->ctrl_;
  if (pcVar3 != (ctrl_t *)0x0) {
    uVar4 = this->capacity_;
    if ((uVar4 + 1 & uVar4) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar26 = hashval >> 7;
    auVar28 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar28 = pshuflw(auVar28,auVar28,0);
    psVar5 = this->slots_;
    iVar2 = *key;
    lVar25 = 0;
    while( true ) {
      uVar26 = uVar26 & uVar4;
      pcVar1 = pcVar3 + uVar26;
      cVar8 = *pcVar1;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      cVar30 = auVar28[0];
      auVar31[0] = -(cVar30 == cVar8);
      cVar32 = auVar28[1];
      auVar31[1] = -(cVar32 == cVar9);
      cVar33 = auVar28[2];
      auVar31[2] = -(cVar33 == cVar10);
      cVar34 = auVar28[3];
      auVar31[3] = -(cVar34 == cVar11);
      auVar31[4] = -(cVar30 == cVar12);
      auVar31[5] = -(cVar32 == cVar13);
      auVar31[6] = -(cVar33 == cVar14);
      auVar31[7] = -(cVar34 == cVar15);
      auVar31[8] = -(cVar30 == cVar16);
      auVar31[9] = -(cVar32 == cVar17);
      auVar31[10] = -(cVar33 == cVar18);
      auVar31[0xb] = -(cVar34 == cVar19);
      auVar31[0xc] = -(cVar30 == cVar20);
      auVar31[0xd] = -(cVar32 == cVar21);
      auVar31[0xe] = -(cVar33 == cVar22);
      auVar31[0xf] = -(cVar34 == cVar23);
      uVar7 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
      if (uVar7 != 0) {
        uVar24 = (uint)uVar7;
        do {
          uVar6 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar27 = uVar6 + uVar26 & uVar4;
          if (psVar5[uVar27].value.first == iVar2) {
            *offset = uVar27;
            return true;
          }
          uVar24 = uVar24 - 1 & uVar24;
        } while (uVar24 != 0);
        *offset = uVar27;
      }
      auVar29[0] = -(cVar8 == -0x80);
      auVar29[1] = -(cVar9 == -0x80);
      auVar29[2] = -(cVar10 == -0x80);
      auVar29[3] = -(cVar11 == -0x80);
      auVar29[4] = -(cVar12 == -0x80);
      auVar29[5] = -(cVar13 == -0x80);
      auVar29[6] = -(cVar14 == -0x80);
      auVar29[7] = -(cVar15 == -0x80);
      auVar29[8] = -(cVar16 == -0x80);
      auVar29[9] = -(cVar17 == -0x80);
      auVar29[10] = -(cVar18 == -0x80);
      auVar29[0xb] = -(cVar19 == -0x80);
      auVar29[0xc] = -(cVar20 == -0x80);
      auVar29[0xd] = -(cVar21 == -0x80);
      auVar29[0xe] = -(cVar22 == -0x80);
      auVar29[0xf] = -(cVar23 == -0x80);
      if ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar29 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar29 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar23 == -0x80)
      break;
      uVar26 = uVar26 + lVar25 + 0x10;
      lVar25 = lVar25 + 0x10;
    }
  }
  return false;
}

Assistant:

bool find_impl(const key_arg<K>& PHMAP_RESTRICT key, size_t hashval, size_t& PHMAP_RESTRICT offset) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ ctrl_ + seq.offset() };
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                offset = seq.offset((size_t)i);
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                    EqualElement<K>{key, eq_ref()},
                    PolicyTraits::element(slots_ + offset))))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
                return false;
            seq.next();
        }
    }